

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execNEST.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* GetBand(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,vector<double,_std::allocator<double>_> *S1s,
         vector<double,_std::allocator<double>_> *S2s,bool resol,int nFold)

{
  double (*padVar1) [7];
  double dVar2;
  pointer pdVar3;
  pointer pvVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  pointer pdVar10;
  ostream *poVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  size_type __new_size;
  ulong uVar19;
  vector<double,_std::allocator<double>_> *pvVar20;
  ulong uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  value_type local_1fd8;
  vector<double,_std::allocator<double>_> *local_1fd0;
  vector<double,_std::allocator<double>_> *local_1fc8;
  vector<double,_std::allocator<double>_> *local_1fc0;
  double local_1fb8;
  allocator_type local_1fa9;
  double local_1fa8;
  double dStack_1fa0;
  double local_1f98;
  undefined8 uStack_1f90;
  double local_1f88;
  double dStack_1f80;
  uint64_t reject [1000];
  
  __new_size = (size_type)numBins;
  local_1fd0 = S1s;
  if (1000 < (long)__new_size) {
    if (0 < verbosity) {
      poVar11 = std::operator<<((ostream *)&std::cerr,
                                "ERROR: Too many bins. Decrease numBins (analysis.hh) or increase NUMBINS_MAX (TestSpectra.hh)"
                               );
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    exit(1);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1fd8 = -999.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)reject,1,&local_1fd8,&local_1fa9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(__return_storage_ptr__,__new_size,(value_type *)reject);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)reject);
  local_1fa8 = (double)numBins;
  pdVar12 = &maxS1;
  if (useS2 == 2) {
    pdVar12 = &maxS2;
  }
  local_1fb8 = *pdVar12;
  pdVar12 = &minS1;
  if (useS2 == 2) {
    pdVar12 = &minS2;
  }
  dVar30 = *pdVar12;
  memset(reject,0,8000);
  if (resol) {
    numBins = 1;
    dVar22 = 1.79769313486232e+308;
  }
  else {
    dVar22 = (local_1fb8 - dVar30) / local_1fa8;
  }
  if (nFold == 0) {
    local_1f98 = -1.79769313486232e+308;
  }
  else {
    local_1f98 = 0.0;
  }
  uStack_1f90 = 0;
  dVar31 = dVar22 * 0.5;
  dVar30 = dVar30 + dVar31;
  pdVar10 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar21 = 0;
  local_1fc8 = S2s;
  local_1fb8 = dVar22;
  local_1fa8 = dVar31;
  do {
    if ((ulong)((long)(local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar10 >> 3) <= uVar21) {
      pvVar20 = (vector<double,_std::allocator<double>_> *)0x0;
      while (pvVar9 = local_1fc8, (long)pvVar20 < (long)numBins) {
        padVar1 = band + (long)pvVar20;
        if (band[(long)pvVar20][0] <= 0.0 && !resol) {
          (*padVar1)[0] = (double)(int)pvVar20 * local_1fb8 + dVar30;
        }
        pvVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::vector<double,_std::allocator<double>_>::erase
                  (pvVar4 + (long)pvVar20,
                   (const_iterator)
                   pvVar4[(long)pvVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start);
        pvVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar17 = *(long *)&pvVar4[(long)pvVar20].super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data;
        lVar14 = (long)*(pointer *)
                        ((long)&pvVar4[(long)pvVar20].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + 8) - lVar17;
        lVar15 = lVar14 >> 3;
        lVar16 = lVar15;
        if (lVar14 == 0 && resol) {
          pdVar10 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar16 = (long)(local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
          for (lVar18 = 0; lVar16 != lVar18; lVar18 = lVar18 + 1) {
            (*padVar1)[0] = ABS(pdVar10[lVar18]) + (*padVar1)[0];
          }
        }
        auVar25._8_4_ = (int)((ulong)lVar16 >> 0x20);
        auVar25._0_8_ = lVar16;
        auVar25._12_4_ = 0x45300000;
        dVar22 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0);
        if (resol) {
          (*padVar1)[0] = (*padVar1)[0] / dVar22;
        }
        auVar27._8_4_ = (int)(lVar14 >> 0x23);
        auVar27._0_8_ = lVar15;
        auVar27._12_4_ = 0x45300000;
        dStack_1fa0 = auVar27._8_8_ - 1.9342813113834067e+25;
        local_1fa8 = dStack_1fa0 + ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0);
        auVar28._8_8_ = dVar22;
        auVar28._0_8_ = dVar22;
        if (dVar22 <= local_1fa8) {
          local_1fa8 = dVar22;
        }
        auVar23 = divpd(*(undefined1 (*) [16])(band[(long)pvVar20] + 1),auVar28);
        uVar8 = (int)local_1fa8;
        if ((int)local_1fa8 < 1) {
          uVar8 = 0;
        }
        *(undefined1 (*) [16])(band[(long)pvVar20] + 1) = auVar23;
        for (uVar21 = 0; uVar8 != uVar21; uVar21 = uVar21 + 1) {
          dVar22 = *(double *)(lVar17 + uVar21 * 8);
          if ((dVar22 != -999.0) || (NAN(dVar22))) {
            dVar22 = dVar22 - auVar23._8_8_;
            band[(long)pvVar20][3] = dVar22 * dVar22 + band[(long)pvVar20][3];
          }
        }
        pdVar10 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (lVar17 = 0; (long)pdVar3 - (long)pdVar10 >> 3 != lVar17; lVar17 = lVar17 + 1) {
          if (((resol) && (dVar22 = pdVar10[lVar17], local_1f98 < dVar22)) &&
             (0.0 < (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar17])) {
            dVar22 = dVar22 - (*padVar1)[0];
            auVar23._0_8_ = auVar23._0_8_ + dVar22 * dVar22;
            band[(long)pvVar20][1] = auVar23._0_8_;
          }
        }
        dVar31 = local_1fa8 + -1.0;
        dVar22 = band[(long)pvVar20][3] / dVar31;
        local_1fc0 = pvVar20;
        if (dVar22 < 0.0) {
          local_1f88 = dVar31;
          dStack_1f80 = dStack_1fa0;
          dVar22 = sqrt(dVar22);
          dVar31 = local_1f88;
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        band[(long)pvVar20][3] = dVar22;
        if (resol) {
          dVar31 = band[(long)pvVar20][1] / dVar31;
          if (dVar31 < 0.0) {
            dVar31 = sqrt(dVar31);
          }
          else {
            dVar31 = SQRT(dVar31);
          }
          band[(long)pvVar20][1] = dVar31;
          dVar22 = band[(long)pvVar20][3];
        }
        auVar29._0_8_ = (double)CONCAT44(0x43300000,(int)reject[(long)local_1fc0]);
        auVar29._8_4_ = (int)(reject[(long)local_1fc0] >> 0x20);
        auVar29._12_4_ = 0x45300000;
        auVar24._8_8_ = local_1fa8;
        auVar24._0_8_ = dVar22;
        auVar7._8_8_ = (auVar29._8_8_ - 1.9342813113834067e+25) +
                       (auVar29._0_8_ - 4503599627370496.0) + local_1fa8;
        auVar7._0_8_ = SQRT(local_1fa8);
        auVar25 = divpd(auVar24,auVar7);
        *(undefined1 (*) [16])(band[(long)pvVar20] + 4) = auVar25;
        for (uVar21 = 0; uVar8 != uVar21; uVar21 = uVar21 + 1) {
          dVar22 = *(double *)
                    (*(long *)&(__return_storage_ptr__->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[(long)pvVar20].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar21 * 8);
          if ((dVar22 != -999.0) || (NAN(dVar22))) {
            dVar22 = pow((dVar22 - band[(long)pvVar20][2]) / band[(long)pvVar20][3],3.0);
            band[(long)pvVar20][6] = dVar22 + band[(long)pvVar20][6];
          }
        }
        band[(long)pvVar20][6] = band[(long)pvVar20][6] / (local_1fa8 + -2.0);
        pvVar20 = (vector<double,_std::allocator<double>_> *)
                  ((long)&(local_1fc0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + 1);
      }
      return __return_storage_ptr__;
    }
    uVar13 = (ulong)(uint)numBins;
    if (numBins < 1) {
      uVar13 = 0;
    }
    for (uVar19 = 0; uVar19 != uVar13; uVar19 = uVar19 + 1) {
      dVar26 = (double)(int)uVar19 * dVar22 + dVar30;
      if (uVar21 == 0 && !resol) {
        band[uVar19][0] = dVar26;
      }
      dVar2 = pdVar10[uVar21];
      dVar22 = local_1fb8;
      if (dVar26 - dVar31 < ABS(dVar2)) {
        if ((nFold == 0) || (ABS(dVar2) <= dVar26 + dVar31)) goto LAB_0010a2b0;
      }
      else if (nFold == 0) {
LAB_0010a2b0:
        if (local_1f98 <= dVar2) {
          pdVar3 = (local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar26 = pdVar3[uVar21];
          if (0.0 <= dVar26) {
            if (resol) {
              std::vector<double,_std::allocator<double>_>::push_back
                        ((__return_storage_ptr__->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + (uVar19 & 0xffffffff),
                         pdVar3 + uVar21);
            }
            else {
              bVar5 = dVar26 == 0.0;
              bVar6 = dVar2 == 0.0;
              if (useS2 == 1) {
                if (((bVar6 || bVar5) || (dVar22 = log10(dVar26), dVar22 <= logMin)) ||
                   (dVar22 = log10((local_1fc8->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_start[uVar21]),
                   logMax <= dVar22)) {
                  local_1fd8 = 0.0;
                  std::vector<double,_std::allocator<double>_>::emplace_back<double>
                            ((__return_storage_ptr__->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + (uVar19 & 0xffffffff),
                             &local_1fd8);
                }
                else {
                  local_1fc0 = (__return_storage_ptr__->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + (uVar19 & 0xffffffff);
                  local_1fd8 = log10((local_1fc8->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start[uVar21]);
                  std::vector<double,_std::allocator<double>_>::emplace_back<double>
                            (local_1fc0,&local_1fd8);
                }
              }
              else if (useS2 == 0) {
                if (((bVar6 || bVar5) || (dVar22 = log10(dVar26 / dVar2), dVar22 <= logMin)) ||
                   (dVar22 = log10((local_1fc8->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_start[uVar21] /
                                   (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_start[uVar21]),
                   logMax <= dVar22)) {
                  local_1fd8 = 0.0;
                  std::vector<double,_std::allocator<double>_>::emplace_back<double>
                            ((__return_storage_ptr__->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + (uVar19 & 0xffffffff),
                             &local_1fd8);
                }
                else {
                  local_1fc0 = (__return_storage_ptr__->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + (uVar19 & 0xffffffff);
                  local_1fd8 = log10((local_1fc8->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start[uVar21] /
                                     (local_1fd0->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start[uVar21]);
                  std::vector<double,_std::allocator<double>_>::emplace_back<double>
                            (local_1fc0,&local_1fd8);
                }
              }
              else if (((bVar6 || bVar5) || (dVar22 = log10(dVar2 / dVar26), dVar22 <= logMin)) ||
                      (dVar22 = log10((local_1fd0->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start[uVar21] /
                                      (local_1fc8->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start[uVar21]), logMax <= dVar22))
              {
                local_1fd8 = 0.0;
                std::vector<double,_std::allocator<double>_>::emplace_back<double>
                          ((__return_storage_ptr__->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + (uVar19 & 0xffffffff),
                           &local_1fd8);
              }
              else {
                local_1fc0 = (__return_storage_ptr__->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + (uVar19 & 0xffffffff);
                local_1fd8 = log10((local_1fd0->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_start[uVar21] /
                                   (local_1fc8->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_start[uVar21]);
                std::vector<double,_std::allocator<double>_>::emplace_back<double>
                          (local_1fc0,&local_1fd8);
              }
            }
            uVar19 = uVar19 & 0xffffffff;
            band[uVar19][2] =
                 (*(pointer *)
                   ((long)&(__return_storage_ptr__->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar19].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + 8))[-1] + band[uVar19][2];
            pdVar10 = (local_1fd0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar31 = local_1fa8;
            dVar22 = local_1fb8;
            if (resol) {
              band[uVar19][0] = pdVar10[uVar21] + band[uVar19][0];
            }
            else {
              band[uVar19][1] = pdVar10[uVar21] + band[uVar19][1];
            }
            break;
          }
        }
        reject[uVar19 & 0xffffffff] = reject[uVar19 & 0xffffffff] + 1;
        break;
      }
    }
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

vector<vector<double>> GetBand(vector<double> S1s, vector<double> S2s,
                               bool resol, int nFold) {
  if (numBins > NUMBINS_MAX) {
    if (verbosity > 0)
      cerr << "ERROR: Too many bins. Decrease numBins (analysis.hh) or "
              "increase NUMBINS_MAX (TestSpectra.hh)"
           << endl;
    exit(EXIT_FAILURE);
  }

  vector<vector<double>> signals;
  signals.resize(numBins, vector<double>(1, -999.));
  double binWidth, border;
  if (useS2 == 2) {
    binWidth = (maxS2 - minS2) / double(numBins);
    border = minS2;
  } else {
    binWidth = (maxS1 - minS1) / double(numBins);
    border = minS1;
  }
  int i = 0, j = 0;
  double s1c, numPts;
  uint64_t reject[NUMBINS_MAX] = {0};

  if (resol) {
    numBins = 1;
    binWidth = DBL_MAX;
  }

  double ReqS1 = 0.;
  if (nFold == 0) ReqS1 = -DBL_MAX;
  for (i = 0; i < S1s.size(); ++i) {
    for (j = 0; j < numBins; ++j) {
      s1c = border + binWidth / 2. + double(j) * binWidth;
      if (i == 0 && !resol) band[j][0] = s1c;
      if ((std::abs(S1s[i]) > (s1c - binWidth / 2.) &&
           std::abs(S1s[i]) <= (s1c + binWidth / 2.)) ||
          !nFold) {
        if (S1s[i] >= ReqS1 && S2s[i] >= 0.) {
          if (resol) {
            signals[j].push_back(S2s[i]);
          } else {
            if (useS2 == 0) {
              if (S1s[i] && S2s[i] && log10(S2s[i] / S1s[i]) > logMin &&
                  log10(S2s[i] / S1s[i]) < logMax)
                signals[j].push_back(log10(S2s[i] / S1s[i]));
              else
                signals[j].push_back(0.);
            } else if (useS2 == 1) {
              if (S1s[i] && S2s[i] && log10(S2s[i]) > logMin &&
                  log10(S2s[i]) < logMax)
                signals[j].push_back(log10(S2s[i]));
              else
                signals[j].push_back(0.);
            } else {
              if (S1s[i] && S2s[i] && log10(S1s[i] / S2s[i]) > logMin &&
                  log10(S1s[i] / S2s[i]) < logMax)
                signals[j].push_back(log10(S1s[i] / S2s[i]));
              else
                signals[j].push_back(0.);
            }
          }
          band[j][2] += signals[j].back();
          if (resol)
            band[j][0] += S1s[i];
          else
            band[j][1] += S1s[i];
        } else
          ++reject[j];
        break;
      }
    }
  }

  for (j = 0; j < numBins; ++j) {
    if (band[j][0] <= 0. && !resol)
      band[j][0] = border + binWidth / 2. + double(j) * binWidth;
    signals[j].erase(signals[j].begin());
    numPts = (double)signals[j].size();
    if (numPts <= 0 && resol) {
      for (i = 0; i < S1s.size(); ++i) band[j][0] += std::abs(S1s[i]);
      numPts = S1s.size();
    }
    if (resol) band[j][0] /= numPts;
    band[j][1] /= numPts;
    band[j][2] /= numPts;
    if (numPts > signals[j].size())
      numPts = signals[j].size();  // seg fault prevention line
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][3] += pow(signals[j][i] - band[j][2], 2.);  // std dev calc
    }
    for (i = 0; i < S1s.size(); ++i) {
      if (resol && S1s[i] > ReqS1 && S2s[i] > 0.0)
        band[j][1] += pow(S1s[i] - band[j][0], 2.);  // std dev calc
    }
    band[j][3] /= numPts - 1.;
    band[j][3] = sqrt(band[j][3]);
    if (resol) {
      band[j][1] /= numPts - 1.;
      band[j][1] = sqrt(band[j][1]);
    }
    band[j][4] = band[j][3] / sqrt(numPts);
    band[j][5] = numPts / (numPts + double(reject[j]));
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][6] +=
            pow((signals[j][i] - band[j][2]) / band[j][3], 3.);  // skew calc
    }
    band[j][6] /= (numPts - 2.);
  }

  return signals;
}